

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

size_t jessilib::find<char,char,false>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_substring)

{
  bool bVar1;
  char32_t cVar2;
  size_t sVar3;
  jessilib *pjVar4;
  size_t sVar5;
  jessilib *pjVar6;
  jessilib *this;
  jessilib *this_00;
  jessilib *this_01;
  char cVar7;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char,_std::char_traits<char>_> in_string_02;
  decode_result dVar8;
  decode_result dVar9;
  char *local_70;
  char *local_50;
  char *local_48;
  char *local_40;
  
  pjVar4 = (jessilib *)in_substring._M_len;
  in_string_00._M_len = in_string._M_str;
  this_01 = (jessilib *)in_string._M_len;
  if (pjVar4 == (jessilib *)0x0) {
    local_70 = (char *)0x0;
  }
  else if (this_01 == (jessilib *)0x0) {
LAB_00106443:
    local_70 = (char *)0xffffffffffffffff;
  }
  else {
    if (pjVar4 == (jessilib *)0x1) {
      in_string_00._M_str._0_4_ = (int)*in_substring._M_str;
      in_string_00._M_str._4_4_ = 0;
      sVar3 = find<char,false>(this_01,in_string_00,(char32_t)in_substring._M_str);
      return sVar3;
    }
    local_50 = (char *)0x0;
    pjVar6 = pjVar4;
    do {
      this = pjVar4;
      this_00 = this_01;
      local_48 = in_substring._M_str;
      local_40 = in_string_00._M_len;
      if (this_01 < pjVar4) goto LAB_00106443;
      do {
        in_string_01._M_str = (char *)pjVar6;
        in_string_01._M_len = (size_t)local_40;
        dVar8 = decode_codepoint_utf8<char>(this_00,in_string_01);
        in_string_02._M_str = (char *)dVar8.units;
        in_string_02._M_len = (size_t)local_48;
        dVar9 = decode_codepoint_utf8<char>(this,in_string_02);
        sVar3 = dVar9.units;
        cVar7 = '\x01';
        if ((in_string_02._M_str == (char *)0x0) || (sVar3 == 0)) {
          local_70 = (char *)0xffffffffffffffff;
        }
        else {
          sVar5 = sVar3;
          if (dVar8.codepoint != dVar9.codepoint) {
            cVar2 = jessilib::fold(dVar8.codepoint);
            dVar9 = (decode_result)jessilib::fold(dVar9.codepoint);
            sVar5 = dVar9.units;
            cVar7 = '\x04';
            if (cVar2 != dVar9.codepoint) goto LAB_001063fb;
          }
          local_40 = local_40 + (long)in_string_02._M_str;
          this_00 = this_00 + -(long)in_string_02._M_str;
          local_48 = local_48 + sVar3;
          this = this + -sVar3;
          cVar7 = this == (jessilib *)0x0;
          if ((bool)cVar7) {
            local_70 = local_50;
          }
          dVar9.units = sVar5;
          dVar9._0_8_ = local_70;
        }
LAB_001063fb:
        pjVar6 = (jessilib *)dVar9.units;
        if (cVar7 != '\0') {
          if (cVar7 != '\x04') {
            bVar1 = false;
            goto LAB_00106434;
          }
          break;
        }
      } while (this_00 != (jessilib *)0x0);
      in_string_00._M_len = in_string_00._M_len + (long)in_string_02._M_str;
      this_01 = this_01 + -(long)in_string_02._M_str;
      local_50 = local_50 + (long)in_string_02._M_str;
      bVar1 = true;
LAB_00106434:
    } while (bVar1);
  }
  return (size_t)local_70;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_substring) {
	// If we're searching for nothing, then we've found it at the front
	if (in_substring.empty()) {
		return 0;
	}

	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	// TODO: expand this to cover any instance where in_substring is a single codepoint, rather than a single data unit
	if (in_substring.size() == 1) {
		return find<LhsCharT, CaseSensitive>(in_string, in_substring[0]);
	}

	// TODO: optimize for when in_substring is small and of different type, by only decoding it once

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
		if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
			if (in_string.size() < in_substring.size()) {
				return decltype(in_string)::npos;
			}
		}

		std::basic_string_view<LhsCharT> string = in_string;
		std::basic_string_view<RhsCharT> substring = in_substring;
		decode_result string_front;
		do {
			// TODO: optimize this for when in_string and in_substring are same type, by only decoding in_string, solely
			// to determine number of data units to compare
			string_front = decode_codepoint(string);
			decode_result prefix_front = decode_codepoint(substring);

			if (string_front.units == 0
				|| prefix_front.units == 0) {
				// Failed to decode front codepoint; bad unicode sequence
				return decltype(in_string)::npos;
			}

			if constexpr (CaseSensitive) {
				if (string_front.codepoint != prefix_front.codepoint) {
					// Codepoints aren't the same; break & try next position
					break;
				}
			}
			else {
				if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
					// Codepoints don't fold the same; break & try next position
					break;
				}
			}

			// Codepoints are equal; trim off the fronts and continue
			string.remove_prefix(string_front.units);
			substring.remove_prefix(prefix_front.units);

			if (substring.empty()) {
				// We found the substring! We can return our current position
				return codepoints_removed;
			}
		} while (!string.empty());

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}